

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O3

bool __thiscall
soplex::SPxLPBase<double>::readFile
          (SPxLPBase<double> *this,char *filename,NameSet *rowNames,NameSet *colNames,
          DIdxSet *intVars)

{
  int iVar1;
  undefined1 uVar2;
  spxifstream file;
  allocator local_361;
  string local_360;
  undefined1 local_340 [536];
  ios_base local_128 [264];
  
  std::__cxx11::string::string((string *)&local_360,filename,&local_361);
  zstr::ifstream::ifstream((ifstream *)local_340,&local_360,_S_in,0x100000);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  if (((byte)(*(_func_int **)(local_340._0_8_ + -0x18))[(long)(local_340 + 0x20)] & 5) == 0) {
    iVar1 = (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
              super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x1e])
                      (this,local_340,rowNames,colNames,intVars);
    uVar2 = (undefined1)iVar1;
  }
  else {
    uVar2 = 0;
  }
  zstr::ifstream::~ifstream((ifstream *)local_340,&zstr::ifstream::VTT);
  std::ios_base::~ios_base((ios_base *)(local_340 + 0x218));
  return (bool)uVar2;
}

Assistant:

virtual bool readFile(const char* filename, NameSet* rowNames = nullptr,
                         NameSet* colNames = nullptr,
                         DIdxSet* intVars = nullptr)
   {

      spxifstream file(filename);

      if(!file)
         return false;

      return read(file, rowNames, colNames, intVars);
   }